

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O3

void write_cb(uv_write_t *req,int status)

{
  void *pvVar1;
  undefined8 *extraout_RDX;
  int iVar2;
  ulong uVar3;
  undefined8 *__size;
  uv_shutdown_t *puVar4;
  undefined8 uStack_18;
  code *pcStack_10;
  
  uVar3 = (ulong)(uint)status;
  if (req == (uv_write_t *)0x0) {
    pcStack_10 = (code *)0x1ce680;
    write_cb_cold_2();
  }
  else if (status == 0) {
    bytes_sent_done = bytes_sent_done + 0x2728000;
    write_cb_called = write_cb_called + 1;
    return;
  }
  iVar2 = (int)uVar3;
  puVar4 = (uv_shutdown_t *)(uVar3 & 0xffffffff);
  pcStack_10 = shutdown_cb;
  write_cb_cold_1();
  if (puVar4 == &shutdown_req) {
    pcStack_10 = (code *)(long)iVar2;
    uStack_18 = 0;
    if (pcStack_10 != (code *)0x0) goto LAB_001ce70a;
    pcStack_10 = (code *)(shutdown_req.handle)->write_queue_size;
    uStack_18 = 0;
    if (pcStack_10 == (code *)0x0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      pcStack_10 = (code *)(long)write_cb_called;
      uStack_18 = 3;
      if (pcStack_10 == (code *)0x3) {
        return;
      }
      goto LAB_001ce728;
    }
  }
  else {
    shutdown_cb_cold_1();
LAB_001ce70a:
    shutdown_cb_cold_2();
  }
  shutdown_cb_cold_3();
LAB_001ce728:
  __size = &uStack_18;
  shutdown_cb_cold_4();
  pvVar1 = malloc((size_t)__size);
  *extraout_RDX = pvVar1;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void write_cb(uv_write_t* req, int status) {
  ASSERT_NOT_NULL(req);

  if (status) {
    fprintf(stderr, "uv_write error: %s\n", uv_strerror(status));
    ASSERT(0);
  }

  write_cb_called++;
}